

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

void Bmc_CexPrint(Abc_Cex_t *pCex,int nInputs,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  uVar1 = pCex->nRegs;
  Abc_CexPrintStatsInputs(pCex,nInputs);
  if (fVerbose != 0) {
    if (-1 < pCex->iFrame) {
      iVar2 = 0;
      do {
        printf("%3d : ");
        if (nInputs < 1) {
          uVar4 = 0;
          iVar6 = 0;
        }
        else {
          uVar4 = 0;
          iVar5 = nInputs;
          do {
            bVar7 = ((uint)(&pCex[1].iPo)[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0;
            uVar4 = uVar4 + bVar7;
            uVar1 = uVar1 + 1;
            printf("%d",(ulong)bVar7);
            iVar5 = iVar5 + -1;
            iVar6 = nInputs;
          } while (iVar5 != 0);
        }
        uVar3 = 0;
        printf(" %3d ",(ulong)uVar4);
        if (iVar6 < pCex->nPis) {
          uVar3 = 0;
          do {
            bVar7 = ((uint)(&pCex[1].iPo)[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0;
            uVar3 = uVar3 + bVar7;
            uVar1 = uVar1 + 1;
            printf("%d",(ulong)bVar7);
            iVar6 = iVar6 + 1;
          } while (iVar6 < pCex->nPis);
        }
        printf(" %3d\n",(ulong)uVar3);
        bVar7 = iVar2 < pCex->iFrame;
        iVar2 = iVar2 + 1;
      } while (bVar7);
    }
    if (uVar1 != pCex->nBits) {
      __assert_fail("iBit == pCex->nBits",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                    ,0x14c,"void Bmc_CexPrint(Abc_Cex_t *, int, int)");
    }
  }
  return;
}

Assistant:

void Bmc_CexPrint( Abc_Cex_t * pCex, int nInputs, int fVerbose )
{
    int i, k, Count, iBit = pCex->nRegs;
    Abc_CexPrintStatsInputs( pCex, nInputs );
    if ( !fVerbose )
        return;

    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Count = 0;
        printf( "%3d : ", i );
        for ( k = 0; k < nInputs; k++ )
        {
            Count += Abc_InfoHasBit(pCex->pData, iBit);
            printf( "%d", Abc_InfoHasBit(pCex->pData, iBit++) );
        }
        printf( " %3d ", Count );
        Count = 0;
        for (      ; k < pCex->nPis; k++ )
        {
            Count += Abc_InfoHasBit(pCex->pData, iBit);
            printf( "%d", Abc_InfoHasBit(pCex->pData, iBit++) );
        }
        printf( " %3d\n", Count );
    }
    assert( iBit == pCex->nBits );
}